

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrtrns.cpp
# Opt level: O2

char * u_strToUTF8WithSub_63
                 (char *dest,int32_t destCapacity,int32_t *pDestLength,UChar *pSrc,int32_t srcLength
                 ,UChar32 subchar,int32_t *pNumSubstitutions,UErrorCode *pErrorCode)

{
  UChar *pUVar1;
  UChar UVar2;
  UChar UVar3;
  int iVar4;
  UChar *pUVar5;
  ulong uVar6;
  UChar *pUVar7;
  byte bVar8;
  uint uVar9;
  byte *pbVar10;
  byte *pbVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  
  pbVar10 = (byte *)(dest + destCapacity);
  if (dest == (char *)0x0) {
    pbVar10 = (byte *)0x0;
  }
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((((-1 < destCapacity) && (-2 < srcLength)) && (pSrc != (UChar *)0x0 || srcLength == 0)) &&
       ((subchar < 0x110000 && (destCapacity == 0 || dest != (char *)0x0)) &&
        (subchar & 0xfffff800U) != 0xd800)) {
      if (pNumSubstitutions != (int32_t *)0x0) {
        *pNumSubstitutions = 0;
      }
      pbVar11 = (byte *)dest;
      if (srcLength != -1) {
        pUVar5 = pSrc + (uint)srcLength;
        if (pSrc == (UChar *)0x0) {
          pUVar5 = (UChar *)0x0;
        }
        iVar12 = 0;
        do {
          uVar6 = ((long)pbVar10 - (long)pbVar11) / 3;
          uVar15 = (ulong)((long)pUVar5 - (long)pSrc) >> 1;
          if ((int)uVar6 < (int)uVar15) {
            uVar15 = uVar6;
          }
          uVar6 = uVar15 & 0xffffffff;
          if ((int)uVar15 < 3) {
            goto LAB_002c50c8;
          }
          do {
            iVar13 = (int)uVar6;
            pUVar7 = pSrc + 1;
            UVar2 = *pSrc;
            bVar8 = (byte)UVar2;
            if ((ushort)UVar2 < 0x80) {
              *pbVar11 = bVar8;
              pbVar11 = pbVar11 + 1;
              pSrc = pUVar7;
            }
            else if ((ushort)UVar2 < 0x800) {
              *pbVar11 = (byte)((ushort)UVar2 >> 6) | 0xc0;
              pbVar11[1] = bVar8 & 0x3f | 0x80;
              pbVar11 = pbVar11 + 2;
              pSrc = pUVar7;
            }
            else if ((ushort)(UVar2 + L'\x2000') < 0xf800) {
              *pbVar11 = (byte)((ushort)UVar2 >> 0xc) | 0xe0;
              pbVar11[1] = (byte)((ushort)UVar2 >> 6) & 0x3f | 0x80;
              pbVar11[2] = bVar8 & 0x3f | 0x80;
              pbVar11 = pbVar11 + 3;
              pSrc = pUVar7;
            }
            else {
              iVar13 = iVar13 + -1;
              if (iVar13 == 0) break;
              if (((ushort)UVar2 >> 10 & 1) == 0) {
                UVar3 = *pUVar7;
                if (((ushort)UVar3 & 0xfc00) == 0xdc00) {
                  uVar9 = (uint)(ushort)UVar2 * 0x400 + (uint)(ushort)UVar3 + 0xfca02400;
                  *pbVar11 = (byte)(uVar9 >> 0x12) | 0xf0;
                  pbVar11[1] = (byte)(uVar9 >> 0xc) & 0x3f | 0x80;
                  pbVar11[2] = (byte)(uVar9 >> 6) & 0x3f | 0x80;
                  pbVar11[3] = (byte)UVar3 & 0x3f | 0x80;
                  pbVar11 = pbVar11 + 4;
                  pSrc = pSrc + 2;
                  goto LAB_002c4e92;
                }
              }
              if (subchar < 0) goto LAB_002c531a;
              iVar12 = iVar12 + 1;
              pbVar11 = _appendUTF8(pbVar11,subchar);
              pSrc = pUVar7;
            }
LAB_002c4e92:
            uVar6 = (ulong)(iVar13 - 1);
          } while (1 < iVar13);
        } while( true );
      }
      iVar12 = 0;
      while( true ) {
        uVar15 = 2;
        pUVar5 = pSrc + 1;
        UVar2 = *pSrc;
        if (UVar2 == L'\0') break;
        bVar8 = (byte)UVar2;
        if ((ushort)UVar2 < 0x80) {
          uVar15 = 1;
          if (pbVar10 <= pbVar11) goto LAB_002c500c;
          *pbVar11 = bVar8;
          pbVar11 = pbVar11 + 1;
          pSrc = pUVar5;
        }
        else if ((ushort)UVar2 < 0x800) {
          if ((long)pbVar10 - (long)pbVar11 < 2) goto LAB_002c500c;
          *pbVar11 = (byte)((ushort)UVar2 >> 6) | 0xc0;
          pbVar11[1] = bVar8 & 0x3f | 0x80;
          pbVar11 = pbVar11 + 2;
          pSrc = pUVar5;
        }
        else if ((ushort)(UVar2 + L'\x2000') < 0xf800) {
          if ((long)pbVar10 - (long)pbVar11 < 3) {
            uVar15 = 3;
            goto LAB_002c500c;
          }
          *pbVar11 = (byte)((ushort)UVar2 >> 0xc) | 0xe0;
          pbVar11[1] = (byte)((ushort)UVar2 >> 6) & 0x3f | 0x80;
          pbVar11[2] = bVar8 & 0x3f | 0x80;
          pbVar11 = pbVar11 + 3;
          pSrc = pUVar5;
        }
        else {
          if ((((ushort)UVar2 >> 10 & 1) == 0) && (UVar3 = *pUVar5, (UVar3 & 0xfc00U) == 0xdc00)) {
            pUVar5 = pSrc + 2;
            uVar9 = (uint)(ushort)UVar2 * 0x400 + (uint)(ushort)UVar3 + 0xfca02400;
          }
          else {
            if (subchar < 0) goto LAB_002c531a;
            iVar12 = iVar12 + 1;
            uVar9 = subchar;
          }
          uVar6 = 1;
          if (((0x7f < uVar9) && (uVar6 = uVar15, 0x7ff < uVar9)) &&
             ((uVar6 = 3, 0xd7ff < uVar9 && (uVar6 = 0, 0xffefdfff < uVar9 - 0x110000)))) {
            uVar6 = (ulong)(4 - (uVar9 < 0x10000));
          }
          uVar15 = uVar6;
          if ((long)pbVar10 - (long)pbVar11 < (long)uVar6) goto LAB_002c500c;
          pbVar11 = _appendUTF8(pbVar11,uVar9);
          pSrc = pUVar5;
        }
      }
      pUVar5 = pSrc;
      uVar15 = 0;
LAB_002c500c:
      iVar13 = 3;
      if ((uint)subchar < 0x800) {
        iVar13 = 2 - (uint)((uint)subchar < 0x80);
      }
      iVar4 = 0;
      if (0xdfff < (uint)subchar) {
        iVar4 = 4 - (uint)((uint)subchar < 0x10000);
      }
      if ((uint)subchar < 0xd800) {
        iVar4 = iVar13;
      }
      while( true ) {
        uVar14 = (uint)uVar15;
        UVar2 = *pUVar5;
        if (UVar2 == L'\0') break;
        pUVar7 = pUVar5 + 1;
        if ((ushort)UVar2 < 0x80) {
          uVar15 = (ulong)(uVar14 + 1);
          pUVar5 = pUVar7;
        }
        else if ((ushort)UVar2 < 0x800) {
          uVar15 = (ulong)(uVar14 + 2);
          pUVar5 = pUVar7;
        }
        else if ((UVar2 & 0xf800U) == 0xd800) {
          if ((((ushort)UVar2 >> 10 & 1) == 0) && ((*pUVar7 & 0xfc00U) == 0xdc00)) {
            uVar15 = (ulong)(uVar14 + 4);
            pUVar5 = pUVar5 + 2;
          }
          else {
            if (subchar < 0) {
LAB_002c531a:
              *pErrorCode = U_INVALID_CHAR_FOUND;
              return (char *)0x0;
            }
            uVar15 = (ulong)(uVar14 + iVar4);
            iVar12 = iVar12 + 1;
            pUVar5 = pUVar7;
          }
        }
        else {
          uVar15 = (ulong)(uVar14 + 3);
          pUVar5 = pUVar7;
        }
      }
      goto LAB_002c52e2;
    }
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return (char *)0x0;
LAB_002c50c8:
  pUVar7 = pSrc + 1;
  if (pSrc < pUVar5) {
    UVar2 = *pSrc;
    bVar8 = (byte)UVar2;
    if ((ushort)UVar2 < 0x80) {
      uVar14 = 1;
      if (pbVar10 <= pbVar11) goto LAB_002c5236;
      *pbVar11 = bVar8;
      pbVar11 = pbVar11 + 1;
      pSrc = pUVar7;
    }
    else if ((ushort)UVar2 < 0x800) {
      if ((long)pbVar10 - (long)pbVar11 < 2) {
        uVar14 = 2;
        goto LAB_002c5236;
      }
      *pbVar11 = (byte)((ushort)UVar2 >> 6) | 0xc0;
      pbVar11[1] = bVar8 & 0x3f | 0x80;
      pbVar11 = pbVar11 + 2;
      pSrc = pUVar7;
    }
    else if ((ushort)(UVar2 + L'\x2000') < 0xf800) {
      if ((long)pbVar10 - (long)pbVar11 < 3) {
        uVar14 = 3;
        goto LAB_002c5236;
      }
      *pbVar11 = (byte)((ushort)UVar2 >> 0xc) | 0xe0;
      pbVar11[1] = (byte)((ushort)UVar2 >> 6) & 0x3f | 0x80;
      pbVar11[2] = bVar8 & 0x3f | 0x80;
      pbVar11 = pbVar11 + 3;
      pSrc = pUVar7;
    }
    else {
      if ((pUVar7 < pUVar5 && ((ushort)UVar2 >> 10 & 1) == 0) &&
         (UVar3 = *pUVar7, (UVar3 & 0xfc00U) == 0xdc00)) {
        pUVar7 = pSrc + 2;
        uVar9 = (uint)(ushort)UVar2 * 0x400 + (uint)(ushort)UVar3 + 0xfca02400;
      }
      else {
        if (subchar < 0) goto LAB_002c531a;
        iVar12 = iVar12 + 1;
        uVar9 = subchar;
      }
      uVar14 = 1;
      if (((0x7f < uVar9) && (uVar14 = 2, 0x7ff < uVar9)) &&
         ((uVar14 = 3, 0xd7ff < uVar9 && (uVar14 = 0, 0xffefdfff < uVar9 - 0x110000)))) {
        uVar14 = 4 - (uVar9 < 0x10000);
      }
      if ((long)pbVar10 - (long)pbVar11 < (long)(ulong)uVar14) goto LAB_002c5236;
      pbVar11 = _appendUTF8(pbVar11,uVar9);
      pSrc = pUVar7;
    }
    goto LAB_002c50c8;
  }
  pUVar7 = pSrc;
  uVar14 = 0;
LAB_002c5236:
  iVar13 = 3;
  if ((uint)subchar < 0x800) {
    iVar13 = 2 - (uint)((uint)subchar < 0x80);
  }
  iVar4 = 0;
  if (0xdfff < (uint)subchar) {
    iVar4 = 4 - (uint)((uint)subchar < 0x10000);
  }
  if ((uint)subchar < 0xd800) {
    iVar4 = iVar13;
  }
  while (pUVar7 < pUVar5) {
    pUVar1 = pUVar7 + 1;
    UVar2 = *pUVar7;
    if ((ushort)UVar2 < 0x80) {
      uVar14 = uVar14 + 1;
      pUVar7 = pUVar1;
    }
    else if ((ushort)UVar2 < 0x800) {
      uVar14 = uVar14 + 2;
      pUVar7 = pUVar1;
    }
    else if ((UVar2 & 0xf800U) == 0xd800) {
      if (((((ushort)UVar2 >> 10 & 1) == 0) && (pUVar1 < pUVar5)) && ((*pUVar1 & 0xfc00U) == 0xdc00)
         ) {
        uVar14 = uVar14 + 4;
        pUVar7 = pUVar7 + 2;
      }
      else {
        if (subchar < 0) goto LAB_002c531a;
        uVar14 = uVar14 + iVar4;
        iVar12 = iVar12 + 1;
        pUVar7 = pUVar1;
      }
    }
    else {
      uVar14 = uVar14 + 3;
      pUVar7 = pUVar1;
    }
  }
LAB_002c52e2:
  if (pNumSubstitutions != (int32_t *)0x0) {
    *pNumSubstitutions = iVar12;
  }
  iVar12 = uVar14 + ((int)pbVar11 - (int)dest);
  if (pDestLength != (int32_t *)0x0) {
    *pDestLength = iVar12;
  }
  u_terminateChars_63(dest,destCapacity,iVar12,pErrorCode);
  return dest;
}

Assistant:

U_CAPI char* U_EXPORT2 
u_strToUTF8WithSub(char *dest,
            int32_t destCapacity,
            int32_t *pDestLength,
            const UChar *pSrc,
            int32_t srcLength,
            UChar32 subchar, int32_t *pNumSubstitutions,
            UErrorCode *pErrorCode){
    int32_t reqLength=0;
    uint32_t ch=0,ch2=0;
    uint8_t *pDest = (uint8_t *)dest;
    uint8_t *pDestLimit = (pDest!=NULL)?(pDest + destCapacity):NULL;
    int32_t numSubstitutions;

    /* args check */
    if(U_FAILURE(*pErrorCode)){
        return NULL;
    }
        
    if( (pSrc==NULL && srcLength!=0) || srcLength < -1 ||
        (destCapacity<0) || (dest == NULL && destCapacity > 0) ||
        subchar > 0x10ffff || U_IS_SURROGATE(subchar)
    ) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if(pNumSubstitutions!=NULL) {
        *pNumSubstitutions=0;
    }
    numSubstitutions=0;

    if(srcLength==-1) {
        while((ch=*pSrc)!=0) {
            ++pSrc;
            if(ch <= 0x7f) {
                if(pDest<pDestLimit) {
                    *pDest++ = (uint8_t)ch;
                } else {
                    reqLength = 1;
                    break;
                }
            } else if(ch <= 0x7ff) {
                if((pDestLimit - pDest) >= 2) {
                    *pDest++=(uint8_t)((ch>>6)|0xc0);
                    *pDest++=(uint8_t)((ch&0x3f)|0x80);
                } else {
                    reqLength = 2;
                    break;
                }
            } else if(ch <= 0xd7ff || ch >= 0xe000) {
                if((pDestLimit - pDest) >= 3) {
                    *pDest++=(uint8_t)((ch>>12)|0xe0);
                    *pDest++=(uint8_t)(((ch>>6)&0x3f)|0x80);
                    *pDest++=(uint8_t)((ch&0x3f)|0x80);
                } else {
                    reqLength = 3;
                    break;
                }
            } else /* ch is a surrogate */ {
                int32_t length;

                /*need not check for NUL because NUL fails U16_IS_TRAIL() anyway*/
                if(U16_IS_SURROGATE_LEAD(ch) && U16_IS_TRAIL(ch2=*pSrc)) { 
                    ++pSrc;
                    ch=U16_GET_SUPPLEMENTARY(ch, ch2);
                } else if(subchar>=0) {
                    ch=subchar;
                    ++numSubstitutions;
                } else {
                    /* Unicode 3.2 forbids surrogate code points in UTF-8 */
                    *pErrorCode = U_INVALID_CHAR_FOUND;
                    return NULL;
                }

                length = U8_LENGTH(ch);
                if((pDestLimit - pDest) >= length) {
                    /* convert and append*/
                    pDest=_appendUTF8(pDest, ch);
                } else {
                    reqLength = length;
                    break;
                }
            }
        }
        while((ch=*pSrc++)!=0) {
            if(ch<=0x7f) {
                ++reqLength;
            } else if(ch<=0x7ff) {
                reqLength+=2;
            } else if(!U16_IS_SURROGATE(ch)) {
                reqLength+=3;
            } else if(U16_IS_SURROGATE_LEAD(ch) && U16_IS_TRAIL(ch2=*pSrc)) {
                ++pSrc;
                reqLength+=4;
            } else if(subchar>=0) {
                reqLength+=U8_LENGTH(subchar);
                ++numSubstitutions;
            } else {
                /* Unicode 3.2 forbids surrogate code points in UTF-8 */
                *pErrorCode = U_INVALID_CHAR_FOUND;
                return NULL;
            }
        }
    } else {
        const UChar *pSrcLimit = (pSrc!=NULL)?(pSrc+srcLength):NULL;
        int32_t count;

        /* Faster loop without ongoing checking for pSrcLimit and pDestLimit. */
        for(;;) {
            /*
             * Each iteration of the inner loop progresses by at most 3 UTF-8
             * bytes and one UChar, for most characters.
             * For supplementary code points (4 & 2), which are rare,
             * there is an additional adjustment.
             */
            count = (int32_t)((pDestLimit - pDest) / 3);
            srcLength = (int32_t)(pSrcLimit - pSrc);
            if(count > srcLength) {
                count = srcLength; /* min(remaining dest/3, remaining src) */
            }
            if(count < 3) {
                /*
                 * Too much overhead if we get near the end of the string,
                 * continue with the next loop.
                 */
                break;
            }
            do {
                ch=*pSrc++;
                if(ch <= 0x7f) {
                    *pDest++ = (uint8_t)ch;
                } else if(ch <= 0x7ff) {
                    *pDest++=(uint8_t)((ch>>6)|0xc0);
                    *pDest++=(uint8_t)((ch&0x3f)|0x80);
                } else if(ch <= 0xd7ff || ch >= 0xe000) {
                    *pDest++=(uint8_t)((ch>>12)|0xe0);
                    *pDest++=(uint8_t)(((ch>>6)&0x3f)|0x80);
                    *pDest++=(uint8_t)((ch&0x3f)|0x80);
                } else /* ch is a surrogate */ {
                    /*
                     * We will read two UChars and probably output four bytes,
                     * which we didn't account for with computing count,
                     * so we adjust it here.
                     */
                    if(--count == 0) {
                        --pSrc; /* undo ch=*pSrc++ for the lead surrogate */
                        break;  /* recompute count */
                    }

                    if(U16_IS_SURROGATE_LEAD(ch) && U16_IS_TRAIL(ch2=*pSrc)) { 
                        ++pSrc;
                        ch=U16_GET_SUPPLEMENTARY(ch, ch2);

                        /* writing 4 bytes per 2 UChars is ok */
                        *pDest++=(uint8_t)((ch>>18)|0xf0);
                        *pDest++=(uint8_t)(((ch>>12)&0x3f)|0x80);
                        *pDest++=(uint8_t)(((ch>>6)&0x3f)|0x80);
                        *pDest++=(uint8_t)((ch&0x3f)|0x80);
                    } else  {
                        /* Unicode 3.2 forbids surrogate code points in UTF-8 */
                        if(subchar>=0) {
                            ch=subchar;
                            ++numSubstitutions;
                        } else {
                            *pErrorCode = U_INVALID_CHAR_FOUND;
                            return NULL;
                        }

                        /* convert and append*/
                        pDest=_appendUTF8(pDest, ch);
                    }
                }
            } while(--count > 0);
        }

        while(pSrc<pSrcLimit) {
            ch=*pSrc++;
            if(ch <= 0x7f) {
                if(pDest<pDestLimit) {
                    *pDest++ = (uint8_t)ch;
                } else {
                    reqLength = 1;
                    break;
                }
            } else if(ch <= 0x7ff) {
                if((pDestLimit - pDest) >= 2) {
                    *pDest++=(uint8_t)((ch>>6)|0xc0);
                    *pDest++=(uint8_t)((ch&0x3f)|0x80);
                } else {
                    reqLength = 2;
                    break;
                }
            } else if(ch <= 0xd7ff || ch >= 0xe000) {
                if((pDestLimit - pDest) >= 3) {
                    *pDest++=(uint8_t)((ch>>12)|0xe0);
                    *pDest++=(uint8_t)(((ch>>6)&0x3f)|0x80);
                    *pDest++=(uint8_t)((ch&0x3f)|0x80);
                } else {
                    reqLength = 3;
                    break;
                }
            } else /* ch is a surrogate */ {
                int32_t length;

                if(U16_IS_SURROGATE_LEAD(ch) && pSrc<pSrcLimit && U16_IS_TRAIL(ch2=*pSrc)) { 
                    ++pSrc;
                    ch=U16_GET_SUPPLEMENTARY(ch, ch2);
                } else if(subchar>=0) {
                    ch=subchar;
                    ++numSubstitutions;
                } else {
                    /* Unicode 3.2 forbids surrogate code points in UTF-8 */
                    *pErrorCode = U_INVALID_CHAR_FOUND;
                    return NULL;
                }

                length = U8_LENGTH(ch);
                if((pDestLimit - pDest) >= length) {
                    /* convert and append*/
                    pDest=_appendUTF8(pDest, ch);
                } else {
                    reqLength = length;
                    break;
                }
            }
        }
        while(pSrc<pSrcLimit) {
            ch=*pSrc++;
            if(ch<=0x7f) {
                ++reqLength;
            } else if(ch<=0x7ff) {
                reqLength+=2;
            } else if(!U16_IS_SURROGATE(ch)) {
                reqLength+=3;
            } else if(U16_IS_SURROGATE_LEAD(ch) && pSrc<pSrcLimit && U16_IS_TRAIL(ch2=*pSrc)) {
                ++pSrc;
                reqLength+=4;
            } else if(subchar>=0) {
                reqLength+=U8_LENGTH(subchar);
                ++numSubstitutions;
            } else {
                /* Unicode 3.2 forbids surrogate code points in UTF-8 */
                *pErrorCode = U_INVALID_CHAR_FOUND;
                return NULL;
            }
        }
    }

    reqLength+=(int32_t)(pDest - (uint8_t *)dest);

    if(pNumSubstitutions!=NULL) {
        *pNumSubstitutions=numSubstitutions;
    }

    if(pDestLength){
        *pDestLength = reqLength;
    }

    /* Terminate the buffer */
    u_terminateChars(dest, destCapacity, reqLength, pErrorCode);
    return dest;
}